

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *vec)

{
  long lVar1;
  ulong uVar2;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&local_a0);
  uVar2 = (ulong)(uint)vec->memused;
  lVar1 = uVar2 * 0x3c;
  while( true ) {
    if ((int)uVar2 < 1) break;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,
               &(this->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(int *)((long)(&vec->m_elem[-1].val + 1) + lVar1)].m_backend,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)vec->m_elem[-1].val.m_backend.data._M_elems + lVar1));
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_a0,&local_68);
    uVar2 = (ulong)((int)uVar2 - 1);
    lVar1 = lVar1 + -0x3c;
  }
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       local_a0.data._M_elems._32_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       local_a0.data._M_elems._16_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       local_a0.data._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_a0.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       local_a0.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = local_a0.exp;
  (__return_storage_ptr__->m_backend).neg = local_a0.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_a0.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_a0.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

inline
R VectorBase<R>::operator*(const SVectorBase<R>& vec) const
{
   assert(dim() >= vec.dim());

   StableSum<R> x;

   for(int i = vec.size() - 1; i >= 0; --i)
      x += val[vec.index(i)] * vec.value(i);

   return x;
}